

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSParticle.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XSParticle::XSParticle
          (XSParticle *this,TERM_TYPE termType,XSModel *xsModel,XSObject *particleTerm,
          XMLSize_t minOccurs,XMLSize_t maxOccurs,bool unbounded,MemoryManager *manager)

{
  bool unbounded_local;
  XMLSize_t maxOccurs_local;
  XMLSize_t minOccurs_local;
  XSObject *particleTerm_local;
  XSModel *xsModel_local;
  TERM_TYPE termType_local;
  XSParticle *this_local;
  
  XSObject::XSObject(&this->super_XSObject,PARTICLE,xsModel,manager);
  (this->super_XSObject)._vptr_XSObject = (_func_int **)&PTR__XSParticle_0052e828;
  this->fTermType = termType;
  this->fMinOccurs = minOccurs;
  this->fMaxOccurs = maxOccurs;
  this->fUnbounded = unbounded;
  this->fTerm = particleTerm;
  return;
}

Assistant:

XSParticle::XSParticle(TERM_TYPE            termType,
                       XSModel* const       xsModel,
                       XSObject* const      particleTerm,
                       XMLSize_t            minOccurs,
                       XMLSize_t            maxOccurs,
                       bool                 unbounded,
                       MemoryManager* const manager)
    : XSObject(XSConstants::PARTICLE, xsModel, manager)
    , fTermType(termType)
    , fMinOccurs(minOccurs)
    , fMaxOccurs(maxOccurs)
    , fUnbounded (unbounded)
    , fTerm(particleTerm)
{
}